

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64AddressingModes.h
# Opt level: O2

_Bool AArch64_AM_isValidDecodeLogicalImmediate(uint64_t val,uint regSize)

{
  uint count;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar3 = val >> 0xc & 0xfffff;
  uVar1 = 0;
  if ((regSize == 0x20 & (byte)uVar3) == 0) {
    uVar4 = (uint)val & 0x3f;
    for (uVar2 = (((uint)uVar3 & 1) << 6 | uVar4) ^ 0x3f; (uVar1 != 0x1f && (-1 < (int)uVar2));
        uVar2 = uVar2 * 2) {
      uVar1 = uVar1 + 1;
    }
    if (uVar1 < 0x20) {
      return (uVar4 | -(0x80000000U >> ((byte)uVar1 & 0x1f))) != 0xffffffff;
    }
  }
  return false;
}

Assistant:

static inline bool AArch64_AM_isValidDecodeLogicalImmediate(uint64_t val, unsigned regSize)
{
	unsigned size;
	unsigned S;
	int len;
	// Extract the N and imms fields needed for checking.
	unsigned N = (val >> 12) & 1;
	unsigned imms = val & 0x3f;

	if (regSize == 32 && N != 0) // undefined logical immediate encoding
		return false;
	len = 31 - countLeadingZeros((N << 6) | (~imms & 0x3f));
	if (len < 0) // undefined logical immediate encoding
		return false;
	size = (1 << len);
	S = imms & (size - 1);
	if (S == size - 1) // undefined logical immediate encoding
		return false;

	return true;
}